

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

qpTestResult
glu::TextureTestUtil::compareGenMipmapResult
          (TestLog *log,TextureCube *resultTexture,TextureCube *level0Reference,
          GenMipmapPrecision *precision)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  pointer pPVar2;
  _Alloc_hider imageSetName;
  bool bVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  long *plVar6;
  size_t sVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  TestLog *pTVar10;
  GenMipmapPrecision *precision_00;
  ulong *puVar11;
  ConstPixelBufferAccess *access;
  Surface *surface;
  long lVar12;
  void *__buf;
  void *__buf_00;
  int iVar13;
  MessageBuilder *pMVar14;
  MessageBuilder *pMVar15;
  ulong uVar16;
  void *pvVar17;
  undefined4 uVar18;
  long lVar19;
  undefined7 uVar21;
  char *pcVar20;
  Vec4 threshold;
  Surface errorMask;
  ConstPixelBufferAccess dst;
  ConstPixelBufferAccess src;
  qpTestResult local_494;
  long local_490;
  allocator<char> local_479;
  string local_478;
  Surface local_458;
  LogImageSet local_440;
  long *local_400;
  undefined8 local_3f8;
  long local_3f0;
  undefined8 uStack_3e8;
  long *local_3e0;
  undefined8 local_3d8;
  long local_3d0;
  undefined8 uStack_3c8;
  long *local_3c0;
  undefined8 local_3b8;
  long local_3b0;
  undefined8 uStack_3a8;
  GenMipmapPrecision *local_3a0;
  ulong *local_398;
  long local_390;
  ulong local_388;
  long lStack_380;
  ulong *local_378;
  long local_370;
  ulong local_368;
  long lStack_360;
  undefined4 local_354;
  ConstPixelBufferAccess local_350;
  ulong *local_328;
  long local_320;
  ulong local_318 [2];
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  TextureCube *local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  string local_280;
  ulong *local_260;
  long local_258;
  ulong local_250 [2];
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  ConstPixelBufferAccess local_220;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  TestLog local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_188 [8];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  local_2c8 = resultTexture->m_access;
  lVar19 = 0;
  local_494 = QP_TEST_RESULT_PASS;
  local_3a0 = precision;
  local_2e8 = resultTexture;
  do {
    local_1b8 = (undefined1  [8])0x3f8000003f800000;
    pp_Stack_1b0 = (_func_int **)0x3f8000003f800000;
    local_478._M_dataplus._M_p = (pointer)0x0;
    local_478._M_string_length = 0;
    lVar12 = 0;
    pMVar5 = (MessageBuilder *)&precision->colorThreshold;
    pMVar15 = (MessageBuilder *)local_1b8;
    do {
      pMVar14 = pMVar5;
      if ((local_3a0->colorMask).m_data[lVar12] == false) {
        pMVar14 = pMVar15;
      }
      *(undefined4 *)((long)&local_478._M_dataplus._M_p + lVar12 * 4) =
           *(undefined4 *)&pMVar14->m_log;
      lVar12 = lVar12 + 1;
      pMVar15 = (MessageBuilder *)((long)&pMVar15->m_log + 4);
      pMVar5 = (MessageBuilder *)((long)&pMVar5->m_log + 4);
    } while (lVar12 != 4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::ostream::operator<<((MessageBuilder *)local_1b8,(int)lVar19);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    std::ios_base::~ios_base(local_148);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,0x1cc174b);
    local_440.m_name._M_dataplus._M_p = (pointer)&local_440.m_name.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_440.m_name.field_2._M_allocated_capacity = *psVar9;
      local_440.m_name.field_2._8_4_ = (undefined4)plVar6[3];
      local_440.m_name.field_2._12_4_ = *(undefined4 *)((long)(plVar6 + 3) + 4);
    }
    else {
      local_440.m_name.field_2._M_allocated_capacity = *psVar9;
      local_440.m_name._M_dataplus._M_p = (pointer)*plVar6;
    }
    imageSetName._M_p = local_440.m_name._M_dataplus._M_p;
    local_440.m_name._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_350.m_format = (TextureFormat)(local_350.m_size.m_data + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Level 0, face ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_350);
    local_1b8 = (undefined1  [8])&local_1a8;
    pTVar10 = (TestLog *)(plVar6 + 2);
    if ((TestLog *)*plVar6 == pTVar10) {
      local_1a8.m_log = pTVar10->m_log;
      lStack_1a0 = plVar6[3];
    }
    else {
      local_1a8.m_log = pTVar10->m_log;
      local_1b8 = (undefined1  [8])*plVar6;
    }
    pp_Stack_1b0 = (_func_int **)plVar6[1];
    *plVar6 = (long)pTVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    bVar3 = tcu::floatThresholdCompare
                      (log,imageSetName._M_p,(char *)local_1b8,
                       &(level0Reference->m_access[lVar19].
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       &(local_2c8[lVar19].
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       (Vec4 *)&local_478,COMPARE_LOG_RESULT);
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8.m_log)->flags + 1));
    }
    if (local_350.m_format != (TextureFormat)(local_350.m_size.m_data + 2)) {
      operator_delete((void *)local_350.m_format,local_350._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440.m_name._M_dataplus._M_p != &local_440.m_name.field_2) {
      operator_delete(local_440.m_name._M_dataplus._M_p,
                      local_440.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_220.m_format != (TextureFormat)(local_220.m_size.m_data + 2)) {
      operator_delete((void *)local_220.m_format,local_220._16_8_ + 1);
    }
    if (!bVar3) {
      local_1b8 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,"ERROR: Level 0, face ",0x15);
      pcVar20 = compareGenMipmapResult::s_faceNames[lVar19];
      sVar7 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,pcVar20,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0," comparison failed!",0x13);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
      local_494 = QP_TEST_RESULT_FAIL;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 6);
  if (1 < (int)((ulong)((long)local_2e8->m_access[0].
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2e8->m_access[0].
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    local_490 = 1;
    local_2d0 = 0x30;
    local_2d8 = 0x3c;
    local_2e0 = 0;
    pcVar20 = (char *)0x0;
    do {
      lVar19 = 0;
      do {
        __s = compareGenMipmapResult::s_faceNames[lVar19];
        pPVar2 = local_2c8[lVar19].
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_220.m_format = *(TextureFormat *)(pPVar2 + local_490 + -1);
        lVar12 = 2;
        do {
          local_220.m_size.m_data[lVar12 + -2] =
               *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar12 * 4 + local_2e0 + -8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 5);
        lVar12 = 5;
        do {
          local_220.m_size.m_data[lVar12 + -2] =
               *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar12 * 4 + local_2e0 + -8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 8);
        local_220.m_data = pPVar2[local_490 + -1].super_ConstPixelBufferAccess.m_data;
        local_350.m_format = *(TextureFormat *)(pPVar2 + local_490);
        lVar12 = 0;
        do {
          local_350.m_size.m_data[lVar12] =
               *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar12 * 4 + local_2d0 + -8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        do {
          local_350.m_pitch.m_data[lVar12] =
               *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar12 * 4 + local_2d8 + -8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_350.m_data = pPVar2[local_490].super_ConstPixelBufferAccess.m_data;
        tcu::Surface::Surface(&local_458,local_350.m_size.m_data[0],local_350.m_size.m_data[1]);
        local_440.m_name._M_dataplus._M_p = (pointer)0x300000008;
        pvVar17 = (void *)local_458.m_pixels.m_cap;
        if ((void *)local_458.m_pixels.m_cap != (void *)0x0) {
          pvVar17 = local_458.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_440,local_458.m_width,
                   local_458.m_height,1,pvVar17);
        iVar4 = compareGenMipmapBilinear
                          (&local_350,&local_220,(PixelBufferAccess *)local_1b8,local_3a0);
        uVar18 = (undefined4)CONCAT71((int7)((ulong)pcVar20 >> 8),1);
        iVar13 = (int)local_490;
        if (iVar4 != 0) {
          local_1b8 = (undefined1  [8])log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1b0,"WARNING: Level ",0xf);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", face ",7);
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,__s,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1b0," comparison to bilinear method failed, found ",0x2d);
          std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pp_Stack_1b0," invalid pixels.",0x10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
          std::ios_base::~ios_base(local_140);
          local_440.m_name._M_dataplus._M_p = (pointer)0x300000008;
          pvVar17 = (void *)local_458.m_pixels.m_cap;
          if ((void *)local_458.m_pixels.m_cap != (void *)0x0) {
            pvVar17 = local_458.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_440,local_458.m_width,
                     local_458.m_height,1,pvVar17);
          uVar21 = (undefined7)((ulong)__s >> 8);
          uVar18 = (undefined4)CONCAT71(uVar21,1);
          iVar4 = compareGenMipmapBox(&local_350,&local_220,(PixelBufferAccess *)local_1b8,local_3a0
                                     );
          if (iVar4 != 0) {
            local_1b8 = (undefined1  [8])log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1b0,"WARNING: Level ",0xf);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", face ",7)
            ;
            sVar7 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,__s,sVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1b0," comparison to box method failed, found ",0x28);
            std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pp_Stack_1b0," invalid pixels.",0x10);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
            std::ios_base::~ios_base(local_140);
            if (local_494 == QP_TEST_RESULT_PASS) {
              local_494 = QP_TEST_RESULT_QUALITY_WARNING;
            }
            local_440.m_name._M_dataplus._M_p = (pointer)0x300000008;
            pvVar17 = (void *)local_458.m_pixels.m_cap;
            if ((void *)local_458.m_pixels.m_cap != (void *)0x0) {
              pvVar17 = local_458.m_pixels.m_ptr;
            }
            precision_00 = (GenMipmapPrecision *)(ulong)(uint)local_458.m_height;
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_440,local_458.m_width,
                       local_458.m_height,1,pvVar17);
            uVar18 = (undefined4)CONCAT71(uVar21,1);
            iVar4 = compareGenMipmapVeryLenient
                              (&local_350,&local_220,(PixelBufferAccess *)local_1b8,precision_00);
            if (iVar4 != 0) {
              local_1b8 = (undefined1  [8])log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1b0,"ERROR: Level ",0xd);
              std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1b0,", face ",7);
              sVar7 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,__s,sVar7)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1b0," appears to contain ",0x14);
              std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_1b0," completely wrong pixels, failing case!",0x27);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
              std::ios_base::~ios_base(local_140);
              local_494 = QP_TEST_RESULT_FAIL;
              uVar18 = 0;
            }
          }
        }
        local_308 = local_2f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"Level","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        std::ostream::operator<<((MessageBuilder *)local_1b8,iVar13);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
        std::ios_base::~ios_base(local_148);
        uVar16 = 0xf;
        if (local_308 != local_2f8) {
          uVar16 = local_2f8[0];
        }
        if (uVar16 < (ulong)(local_238 + local_300)) {
          uVar16 = 0xf;
          if (local_240 != local_230) {
            uVar16 = local_230[0];
          }
          if (uVar16 < (ulong)(local_238 + local_300)) goto LAB_018d9593;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_308);
        }
        else {
LAB_018d9593:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_240);
        }
        local_3c0 = &local_3b0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_3b0 = *plVar6;
          uStack_3a8 = puVar8[3];
        }
        else {
          local_3b0 = *plVar6;
          local_3c0 = (long *)*puVar8;
        }
        local_3b8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_3c0);
        local_378 = &local_368;
        puVar11 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar11) {
          local_368 = *puVar11;
          lStack_360 = plVar6[3];
        }
        else {
          local_368 = *puVar11;
          local_378 = (ulong *)*plVar6;
        }
        local_370 = plVar6[1];
        *plVar6 = (long)puVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        std::ostream::operator<<((MessageBuilder *)local_1b8,(int)lVar19);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
        std::ios_base::~ios_base(local_148);
        uVar16 = 0xf;
        if (local_378 != &local_368) {
          uVar16 = local_368;
        }
        if (uVar16 < (ulong)(local_258 + local_370)) {
          uVar16 = 0xf;
          if (local_260 != local_250) {
            uVar16 = local_250[0];
          }
          if (uVar16 < (ulong)(local_258 + local_370)) goto LAB_018d9719;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_378);
        }
        else {
LAB_018d9719:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_260);
        }
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        psVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_478.field_2._M_allocated_capacity = *psVar9;
          local_478.field_2._8_4_ = *(undefined4 *)(puVar8 + 3);
          local_478.field_2._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
        }
        else {
          local_478.field_2._M_allocated_capacity = *psVar9;
          local_478._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_478._M_string_length = puVar8[1];
        *puVar8 = psVar9;
        puVar8[1] = 0;
        *(undefined1 *)psVar9 = 0;
        local_328 = local_318;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"Level ","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        std::ostream::operator<<((MessageBuilder *)local_1b8,iVar13);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
        std::ios_base::~ios_base(local_148);
        uVar16 = 0xf;
        if (local_328 != local_318) {
          uVar16 = local_318[0];
        }
        if (uVar16 < (ulong)(local_298 + local_320)) {
          uVar16 = 0xf;
          if (local_2a0 != local_290) {
            uVar16 = local_290[0];
          }
          if (uVar16 < (ulong)(local_298 + local_320)) goto LAB_018d9854;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_328);
        }
        else {
LAB_018d9854:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_2a0);
        }
        local_400 = &local_3f0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_3f0 = *plVar6;
          uStack_3e8 = puVar8[3];
        }
        else {
          local_3f0 = *plVar6;
          local_400 = (long *)*puVar8;
        }
        local_3f8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_400);
        local_398 = &local_388;
        puVar11 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar11) {
          local_388 = *puVar11;
          lStack_380 = plVar6[3];
        }
        else {
          local_388 = *puVar11;
          local_398 = (ulong *)*plVar6;
        }
        local_390 = plVar6[1];
        *plVar6 = (long)puVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,__s,&local_479);
        uVar16 = 0xf;
        if (local_398 != &local_388) {
          uVar16 = local_388;
        }
        paVar1 = &local_440.m_name.field_2;
        local_354 = uVar18;
        if (uVar16 < (ulong)(local_2b8 + local_390)) {
          uVar16 = 0xf;
          if (local_2c0 != local_2b0) {
            uVar16 = local_2b0[0];
          }
          if (uVar16 < (ulong)(local_2b8 + local_390)) goto LAB_018d99b8;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_398);
        }
        else {
LAB_018d99b8:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_398,(ulong)local_2c0);
        }
        local_3e0 = &local_3d0;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_3d0 = *plVar6;
          uStack_3c8 = puVar8[3];
        }
        else {
          local_3d0 = *plVar6;
          local_3e0 = (long *)*puVar8;
        }
        local_3d8 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_3e0);
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_280.field_2._M_allocated_capacity = *psVar9;
          local_280.field_2._8_8_ = plVar6[3];
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar9;
          local_280._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_280._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::LogImageSet::LogImageSet(&local_440,&local_478,&local_280);
        tcu::TestLog::startImageSet
                  (log,local_440.m_name._M_dataplus._M_p,local_440.m_description._M_dataplus._M_p);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        pcVar20 = "";
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Result","");
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Result","");
        access = &local_350;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b8,&local_1f8,&local_1d8,access,QP_IMAGE_COMPRESSION_MODE_BEST
                  );
        tcu::LogImage::write((LogImage *)local_1b8,(int)log,__buf,(size_t)access);
        if (local_198 != local_188) {
          operator_delete(local_198,local_188[0] + 1);
        }
        uVar18 = local_354;
        if (local_1b8 != (undefined1  [8])&local_1a8) {
          operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440.m_description._M_dataplus._M_p != &local_440.m_description.field_2) {
          operator_delete(local_440.m_description._M_dataplus._M_p,
                          local_440.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440.m_name._M_dataplus._M_p != paVar1) {
          operator_delete(local_440.m_name._M_dataplus._M_p,
                          local_440.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0 + 1);
        }
        if (local_2c0 != local_2b0) {
          operator_delete(local_2c0,local_2b0[0] + 1);
        }
        if (local_398 != &local_388) {
          operator_delete(local_398,local_388 + 1);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400,local_3f0 + 1);
        }
        if (local_2a0 != local_290) {
          operator_delete(local_2a0,local_290[0] + 1);
        }
        if (local_328 != local_318) {
          operator_delete(local_328,local_318[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        if (local_260 != local_250) {
          operator_delete(local_260,local_250[0] + 1);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378,local_368 + 1);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0,local_3b0 + 1);
        }
        if (local_240 != local_230) {
          operator_delete(local_240,local_230[0] + 1);
        }
        if (local_308 != local_2f8) {
          operator_delete(local_308,local_2f8[0] + 1);
        }
        if ((char)uVar18 == '\0') {
          local_440.m_name._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"ErrorMask","");
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"Error mask","");
          surface = &local_458;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_440.m_name,&local_478,surface,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,(int)log,__buf_00,(size_t)surface);
          if (local_198 != local_188) {
            operator_delete(local_198,local_188[0] + 1);
          }
          if (local_1b8 != (undefined1  [8])&local_1a8) {
            operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440.m_name._M_dataplus._M_p != paVar1) {
            operator_delete(local_440.m_name._M_dataplus._M_p,
                            local_440.m_name.field_2._M_allocated_capacity + 1);
          }
        }
        tcu::TestLog::endImageSet(log);
        tcu::Surface::~Surface(&local_458);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 6);
      local_490 = local_490 + 1;
      local_2e0 = local_2e0 + 0x28;
      local_2d0 = local_2d0 + 0x28;
      local_2d8 = local_2d8 + 0x28;
    } while (local_490 <
             (int)((ulong)((long)local_2e8->m_access[0].
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_2e8->m_access[0].
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333);
  }
  return local_494;
}

Assistant:

qpTestResult compareGenMipmapResult (tcu::TestLog& log, const tcu::TextureCube& resultTexture, const tcu::TextureCube& level0Reference, const GenMipmapPrecision& precision)
{
	qpTestResult result = QP_TEST_RESULT_PASS;

	static const char* s_faceNames[] = { "-X", "+X", "-Y", "+Y", "-Z", "+Z" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_faceNames) == tcu::CUBEFACE_LAST);

	// Special comparison for level 0.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace	face		= tcu::CubeFace(faceNdx);
		const tcu::Vec4		threshold	= select(precision.colorThreshold, tcu::Vec4(1.0f), precision.colorMask);
		const bool			level0Ok	= tcu::floatThresholdCompare(log,
																	 ("Level0Face" + de::toString(faceNdx)).c_str(),
																	 (string("Level 0, face ") + s_faceNames[face]).c_str(),
																	 level0Reference.getLevelFace(0, face),
																	 resultTexture.getLevelFace(0, face),
																	 threshold, tcu::COMPARE_LOG_RESULT);

		if (!level0Ok)
		{
			log << tcu::TestLog::Message << "ERROR: Level 0, face " << s_faceNames[face] << " comparison failed!" << tcu::TestLog::EndMessage;
			result = QP_TEST_RESULT_FAIL;
		}
	}

	for (int levelNdx = 1; levelNdx < resultTexture.getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			const tcu::CubeFace					face		= tcu::CubeFace(faceNdx);
			const char*							faceName	= s_faceNames[face];
			const tcu::ConstPixelBufferAccess	src			= resultTexture.getLevelFace(levelNdx-1,	face);
			const tcu::ConstPixelBufferAccess	dst			= resultTexture.getLevelFace(levelNdx,		face);
			tcu::Surface						errorMask	(dst.getWidth(), dst.getHeight());
			bool								levelOk		= false;

			// Try different comparisons in quality order.

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapBilinear(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << ", face " << faceName << " comparison to bilinear method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
			}

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapBox(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << ", face " << faceName <<" comparison to box method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
			}

			// At this point all high-quality methods have been used.
			if (!levelOk && result == QP_TEST_RESULT_PASS)
				result = QP_TEST_RESULT_QUALITY_WARNING;

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapVeryLenient(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "ERROR: Level " << levelNdx << ", face " << faceName << " appears to contain " << numFailed << " completely wrong pixels, failing case!" << tcu::TestLog::EndMessage;
			}

			if (!levelOk)
				result = QP_TEST_RESULT_FAIL;

			log << tcu::TestLog::ImageSet(string("Level") + de::toString(levelNdx) + "Face" + de::toString(faceNdx), string("Level ") + de::toString(levelNdx) + ", face " + string(faceName) + " result")
				<< tcu::TestLog::Image("Result", "Result", dst);

			if (!levelOk)
				log << tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);

			log << tcu::TestLog::EndImageSet;
		}
	}

	return result;
}